

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

DdNode * Llb_Nonlin4ComputeInitState(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fBackward)

{
  abctime aVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  DdNode *pDVar4;
  Aig_Obj_t *local_80;
  abctime TimeStop;
  int i;
  DdNode *bTemp;
  DdNode *bVar;
  DdNode *bRes;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  int fBackward_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  DdManager *dd_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bVar = Cudd_ReadOne(dd);
  Cudd_Ref(bVar);
  for (TimeStop._4_4_ = 0; iVar2 = Saig_ManRegNum(pAig), TimeStop._4_4_ < iVar2;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    pAVar3 = Saig_ManLi(pAig,TimeStop._4_4_);
    local_80 = Saig_ManLo(pAig,TimeStop._4_4_);
    if (fBackward != 0) {
      local_80 = pAVar3;
    }
    iVar2 = Llb_ObjBddVar(vOrder,local_80);
    pDVar4 = Cudd_bddIthVar(dd,iVar2);
    pDVar4 = Cudd_bddAnd(dd,bVar,(DdNode *)((ulong)pDVar4 ^ 1));
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,bVar);
    bVar = pDVar4;
  }
  Cudd_Deref(bVar);
  dd->TimeStop = aVar1;
  return bVar;
}

Assistant:

DdNode * Llb_Nonlin4ComputeInitState( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fBackward )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, fBackward? pObjLi : pObjLo) );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}